

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardFile.cpp
# Opt level: O2

bool __thiscall Diligent::StandardFile::Read(StandardFile *this,void *Data,size_t Size)

{
  size_t sVar1;
  FILE *__stream;
  string msg;
  
  __stream = (FILE *)this->m_pFile;
  if (__stream == (FILE *)0x0) {
    FormatString<char[19]>(&msg,(char (*) [19])"File is not opened");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Read",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/StandardFile.cpp"
               ,0x45);
    std::__cxx11::string::~string((string *)&msg);
    __stream = (FILE *)this->m_pFile;
    if (__stream == (FILE *)0x0) {
      return false;
    }
  }
  sVar1 = fread(Data,1,Size,__stream);
  return sVar1 == Size;
}

Assistant:

bool StandardFile::Read(void* Data, size_t Size)
{
    VERIFY(m_pFile, "File is not opened");
    if (!m_pFile)
        return false;
    auto BytesRead = fread(Data, 1, Size, m_pFile);

    return BytesRead == Size;
}